

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int dupedExprSize(Expr *p)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = 0;
  do {
    iVar3 = 0x48;
    if (((p->flags >> 0x11 & 1) == 0) && (iVar3 = 0x2c, p->pLeft == (Expr *)0x0)) {
      iVar3 = 0x2c;
      if ((p->x).pList == (ExprList *)0x0) {
        iVar3 = 0x10;
      }
    }
    if (((p->flags >> 0xb & 1) == 0) && ((p->u).zToken != (char *)0x0)) {
      sVar1 = strlen((p->u).zToken);
      iVar3 = iVar3 + ((uint)sVar1 & 0x3fffffff) + 1;
    }
    uVar4 = iVar3 + 7U & 0xfffffff8;
    if (p->pLeft != (Expr *)0x0) {
      iVar3 = dupedExprSize(p->pLeft);
      uVar4 = iVar3 + uVar4;
    }
    iVar2 = iVar2 + uVar4;
    p = p->pRight;
  } while (p != (Expr *)0x0);
  return iVar2;
}

Assistant:

static int dupedExprSize(const Expr *p){
  int nByte;
  assert( p!=0 );
  nByte = dupedExprNodeSize(p, EXPRDUP_REDUCE);
  if( p->pLeft ) nByte += dupedExprSize(p->pLeft);
  if( p->pRight ) nByte += dupedExprSize(p->pRight);
  assert( nByte==ROUND8(nByte) );
  return nByte;
}